

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int errParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  void *pvVar4;
  char *__format;
  void *ctx;
  int size;
  xmlChar *base;
  int local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  nb_tests = nb_tests + 1;
  if (((uint)options >> 0x1e & 1) == 0) {
    ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt,testStructuredErrorHandler,0);
    doc = (xmlDocPtr)xmlCtxtReadFile(ctxt,filename,0,options);
    if (((uint)options >> 10 & 1) != 0) {
      local_40 = filename;
      pvVar4 = (void *)xmlXIncludeNewContext(doc);
      xmlXIncludeSetErrorHandler(pvVar4,testStructuredErrorHandler,0);
      xmlXIncludeSetFlags(pvVar4,options);
      ctx = pvVar4;
      iVar1 = xmlXIncludeProcessNode(pvVar4,doc);
      if (iVar1 < 0) {
        testErrorHandler(ctx,"%s : failed to parse\n",local_40);
        xmlFreeDoc(doc);
        doc = (xmlDocPtr)0x0;
      }
      xmlXIncludeFreeContext(pvVar4);
      filename = local_40;
    }
  }
  else {
    ctxt = (xmlParserCtxtPtr)htmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt,testStructuredErrorHandler,0);
    doc = (xmlDocPtr)htmlCtxtReadFile(ctxt,filename,0,options);
  }
  if (result == (char *)0x0) {
LAB_00109097:
    if (err == (char *)0x0) {
      iVar1 = 0;
      if (((options & 0x10U) == 0) || (testErrorsSize == 0)) goto LAB_0010911e;
      __format = "Validation for %s failed\n";
    }
    else {
      iVar2 = compareFileMem(err,testErrors,testErrorsSize);
      iVar1 = 0;
      if (iVar2 == 0) goto LAB_0010911e;
      __format = "Error for %s failed\n";
    }
    fprintf(_stderr,__format,filename);
  }
  else {
    local_48 = (char *)0x0;
    local_38 = err;
    if (doc == (xmlDocPtr)0x0) {
      local_48 = (char *)xmlStrdup("");
      local_4c = 0;
    }
    else if (((uint)options >> 0x1e & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(doc,&local_48,&local_4c);
    }
    iVar1 = compareFileMem(result,local_48,local_4c);
    (*_xmlFree)(local_48);
    err = local_38;
    if (iVar1 == 0) goto LAB_00109097;
    fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
  }
  iVar1 = -1;
LAB_0010911e:
  iVar3 = testParseContent(ctxt,doc,filename);
  iVar2 = -1;
  if (-1 < iVar3) {
    iVar2 = iVar1;
  }
  xmlFreeDoc(doc);
  xmlFreeParserCtxt(ctxt);
  return iVar2;
}

Assistant:

static int
errParseTest(const char *filename, const char *result, const char *err,
             int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int size, res = 0;
    int ret = 0;

    nb_tests++;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        ctxt = htmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
        doc = htmlCtxtReadFile(ctxt, filename, NULL, options);
    } else
#endif
    {
        ctxt = xmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
	doc = xmlCtxtReadFile(ctxt, filename, NULL, options);
#ifdef LIBXML_XINCLUDE_ENABLED
        if (options & XML_PARSE_XINCLUDE) {
            xmlXIncludeCtxtPtr xinc = NULL;

            xinc = xmlXIncludeNewContext(doc);
            xmlXIncludeSetErrorHandler(xinc, testStructuredErrorHandler, NULL);
            xmlXIncludeSetFlags(xinc, options);
            if (xmlXIncludeProcessNode(xinc, (xmlNodePtr) doc) < 0) {
                testErrorHandler(NULL, "%s : failed to parse\n", filename);
                xmlFreeDoc(doc);
                doc = NULL;
            }
            xmlXIncludeFreeContext(xinc);
        }
#endif
    }
    if (result) {
        xmlChar *base = NULL;

	if (doc == NULL) {
	    base = xmlStrdup(BAD_CAST "");
	    size = 0;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML) {
		htmlDocDumpMemory(doc, &base, &size);
	    } else
#endif
	    xmlDocDumpMemory(doc, &base, &size);
	}
	res = compareFileMem(result, (char *) base, size);
	xmlFree(base);
    }

    if (res != 0) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        ret = -1;
    } else if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    ret = -1;
	}
    } else if (options & XML_PARSE_DTDVALID) {
        if (testErrorsSize != 0) {
	    fprintf(stderr, "Validation for %s failed\n", filename);
            ret = -1;
        }
    }

    if (testParseContent(ctxt, doc, filename) < 0)
	ret = -1;

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);
    return(ret);
}